

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall google::protobuf::DescriptorPool::Tables::~Tables(Tables *this)

{
  pointer ppbVar1;
  pointer ppVar2;
  pointer ppcVar3;
  pointer pCVar4;
  pointer ppFVar5;
  pointer ppGVar6;
  pointer ppMVar7;
  LogMessage *other;
  pointer ppvVar8;
  ulong uVar9;
  LogFinisher local_59;
  LogMessage local_58;
  
  if ((this->checkpoints_).
      super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->checkpoints_).
      super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x30e);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: checkpoints_.empty(): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  STLDeleteElements<std::vector<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>>
            (&this->messages_);
  ppvVar8 = (this->allocations_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->allocations_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppvVar8) {
    uVar9 = 0;
    do {
      operator_delete(ppvVar8[uVar9]);
      uVar9 = uVar9 + 1;
      ppvVar8 = (this->allocations_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->allocations_).
                                   super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)ppvVar8 >> 3));
  }
  STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<std::__cxx11::string**,std::vector<std::__cxx11::string*,std::allocator<std::__cxx11::string*>>>>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_**,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
              )(this->strings_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_**,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
              )(this->strings_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  ppbVar1 = (this->strings_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->strings_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppbVar1) {
    (this->strings_).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppbVar1;
  }
  STLDeleteElements<std::vector<google::protobuf::FileDescriptorTables*,std::allocator<google::protobuf::FileDescriptorTables*>>>
            (&this->file_tables_);
  STLDeleteElements<std::vector<google::protobuf::GoogleOnceDynamic*,std::allocator<google::protobuf::GoogleOnceDynamic*>>>
            (&this->once_dynamics_);
  ppVar2 = (this->extensions_after_checkpoint_).
           super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar2 != (pointer)0x0) {
    operator_delete(ppVar2,(long)(this->extensions_after_checkpoint_).
                                 super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar2);
  }
  ppcVar3 = (this->files_after_checkpoint_).
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar3 != (pointer)0x0) {
    operator_delete(ppcVar3,(long)(this->files_after_checkpoint_).
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar3)
    ;
  }
  ppcVar3 = (this->symbols_after_checkpoint_).
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar3 != (pointer)0x0) {
    operator_delete(ppcVar3,(long)(this->symbols_after_checkpoint_).
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar3)
    ;
  }
  pCVar4 = (this->checkpoints_).
           super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar4 != (pointer)0x0) {
    operator_delete(pCVar4,(long)(this->checkpoints_).
                                 super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar4);
  }
  std::
  _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::~_Rb_tree(&(this->extensions_)._M_t);
  std::
  _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&this->files_by_name_);
  std::
  _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&this->symbols_by_name_);
  ppvVar8 = (this->allocations_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppvVar8 != (pointer)0x0) {
    operator_delete(ppvVar8,(long)(this->allocations_).
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppvVar8);
  }
  ppFVar5 = (this->file_tables_).
            super__Vector_base<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppFVar5 != (pointer)0x0) {
    operator_delete(ppFVar5,(long)(this->file_tables_).
                                  super__Vector_base<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppFVar5
                   );
  }
  ppGVar6 = (this->once_dynamics_).
            super__Vector_base<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppGVar6 != (pointer)0x0) {
    operator_delete(ppGVar6,(long)(this->once_dynamics_).
                                  super__Vector_base<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppGVar6
                   );
  }
  ppMVar7 = (this->messages_).
            super__Vector_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppMVar7 != (pointer)0x0) {
    operator_delete(ppMVar7,(long)(this->messages_).
                                  super__Vector_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppMVar7
                   );
  }
  ppbVar1 = (this->strings_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppbVar1 != (pointer)0x0) {
    operator_delete(ppbVar1,(long)(this->strings_).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppbVar1
                   );
  }
  std::
  _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&this->extensions_loaded_from_db_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&this->known_bad_symbols_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&this->known_bad_files_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->pending_files_);
  return;
}

Assistant:

DescriptorPool::Tables::~Tables() {
  GOOGLE_DCHECK(checkpoints_.empty());
  // Note that the deletion order is important, since the destructors of some
  // messages may refer to objects in allocations_.
  STLDeleteElements(&messages_);
  for (int i = 0; i < allocations_.size(); i++) {
    operator delete(allocations_[i]);
  }
  STLDeleteElements(&strings_);
  STLDeleteElements(&file_tables_);
  STLDeleteElements(&once_dynamics_);
}